

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

StringEnumeration *
icu_63::TimeZoneNamesImpl::_getAvailableMetaZoneIDs(UnicodeString *tzID,UErrorCode *status)

{
  int32_t iVar1;
  UVector *this;
  UVector *this_00;
  undefined8 *puVar2;
  StringEnumeration *pSVar3;
  UErrorCode *size;
  void *size_00;
  void *obj;
  int32_t i;
  int index;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    size = status;
    this = ZoneMeta::getMetazoneMappings(tzID);
    if (this == (UVector *)0x0) {
      pSVar3 = (StringEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
      if (pSVar3 != (StringEnumeration *)0x0) {
        StringEnumeration::StringEnumeration(pSVar3);
        (pSVar3->super_UObject)._vptr_UObject = (_func_int **)&PTR__MetaZoneIDsEnumeration_003d3dc0;
        *(undefined8 *)&pSVar3->field_0x74 = 0;
        pSVar3[1].unistr.super_Replaceable.super_UObject._vptr_UObject = (_func_int **)0x0;
        *(undefined8 *)&pSVar3[1].unistr.fUnion = 0;
        return pSVar3;
      }
    }
    else {
      this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
      if (this_00 == (UVector *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        size_00 = (void *)0x0;
        UVector::UVector(this_00,(UObjectDeleter *)0x0,uhash_compareUChars_63,status);
        index = 0;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          do {
            if (this->count <= index) {
              pSVar3 = (StringEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)size_00);
              if (pSVar3 == (StringEnumeration *)0x0) {
                return (StringEnumeration *)0x0;
              }
              StringEnumeration::StringEnumeration(pSVar3);
              (pSVar3->super_UObject)._vptr_UObject =
                   (_func_int **)&PTR__MetaZoneIDsEnumeration_003d3dc0;
              *(undefined8 *)&pSVar3->field_0x74 = 0;
              pSVar3[1].unistr.super_Replaceable.super_UObject._vptr_UObject = (_func_int **)this_00
              ;
              *(UVector **)&pSVar3[1].unistr.fUnion = this_00;
              if (this_00 != (UVector *)0x0) {
                *(int32_t *)&pSVar3->field_0x74 = this_00->count;
                return pSVar3;
              }
              return pSVar3;
            }
            puVar2 = (undefined8 *)UVector::elementAt(this,index);
            obj = (void *)*puVar2;
            size_00 = obj;
            iVar1 = UVector::indexOf(this_00,obj,0);
            if (iVar1 < 0) {
              UVector::addElement(this_00,obj,status);
              size_00 = obj;
            }
            index = index + 1;
          } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
          if (this_00 != (UVector *)0x0) {
            (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
          }
        }
      }
    }
  }
  return (StringEnumeration *)0x0;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }